

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O2

void emtslbl(emtcxdef *ctx,uint *lblp,int release)

{
  uchar *puVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  uint local_3c;
  uint *local_38;
  
  uVar5 = *lblp;
  uVar2 = ctx->emtcxofs;
  ctx->emtcxlbl[uVar5].emtlofs = uVar2;
  puVar1 = &ctx->emtcxlbl[uVar5].emtlflg;
  *puVar1 = *puVar1 | 1;
  uVar6 = ctx->emtcxlbl[uVar5].emtllnk;
  local_38 = lblp;
  while( true ) {
    local_3c = (uint)uVar6;
    if (uVar6 == 0xffff) break;
    uVar3 = ctx->emtcxlbl[uVar6].emtllnk;
    uVar4 = ctx->emtcxlbl[uVar6].emtlofs;
    *(ushort *)(ctx->emtcxptr + uVar4) = uVar2 - uVar4;
    ctx->emtcxlbl[uVar6].emtllnk = 0xffff;
    emtdlbl(ctx,&local_3c);
    uVar6 = uVar3;
  }
  ctx->emtcxlbl[uVar5].emtllnk = 0xffff;
  if (release != 0) {
    emtdlbl(ctx,local_38);
  }
  return;
}

Assistant:

void emtslbl(emtcxdef *ctx, noreg uint *lblp, int release)
{
    uint     lbl = *lblp;
    emtldef *p = &ctx->emtcxlbl[lbl];
    uint     fwd;
    emtldef *fwdp;
    ushort   nxt;
    short    diff;
    ushort   curpos = ctx->emtcxofs;
    
    p->emtlofs = curpos;
    p->emtlflg |= EMTLFSET;
    
    /* run through forward reference list, fixing up each reference */
    for (fwd = p->emtllnk ; fwd != EMTLLNKEND ; fwd = nxt)
    {
        fwdp = &ctx->emtcxlbl[fwd];        /* get pointer to current record */
        nxt = fwdp->emtllnk;                    /* remember the next record */

        /* write the fixup, and release the forward reference */
        diff = curpos - fwdp->emtlofs;
        oswp2(ctx->emtcxptr + fwdp->emtlofs, diff);
        fwdp->emtllnk = EMTLLNKEND;
        emtdlbl(ctx, &fwd);
    }

    p->emtllnk = EMTLLNKEND;    /* there are no more forward refs for label */
    if (release) emtdlbl(ctx, lblp);
}